

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodeCondRegister(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus ret;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  DecodeStatus local_4;
  
  ret = MCDisassembler_Success;
  if (Inst->flat_insn->detail == (cs_detail *)0x0) {
    local_4 = MCDisassembler_Success;
  }
  else {
    switch(Val) {
    case 0:
    case 7:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0;
      break;
    case 1:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0x39;
      break;
    case 2:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0x3a;
      break;
    case 3:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0x3b;
      break;
    case 4:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0x1a;
      break;
    case 5:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0x1b;
      break;
    case 6:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0x19;
      break;
    default:
      *(undefined4 *)&(Inst->flat_insn->detail->field_6).x86.operands[3].field_0x2c = 0;
      ret = MCDisassembler_Fail;
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeCondRegister(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	DecodeStatus ret = MCDisassembler_Success;

	if(!Inst->flat_insn->detail)
		return MCDisassembler_Success;

	switch(Val) {
		case 0:
		case 7:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_INVALID;
			break;
		case 1:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_B0;
			break;
		case 2:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_B1;
			break;
		case 3:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_B2;
			break;
		case 4:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_A1;
			break;
		case 5:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_A2;
			break;
		case 6:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_A0;
			break;
		default:
			Inst->flat_insn->detail->tms320c64x.condition.reg = TMS320C64X_REG_INVALID;
			ret = MCDisassembler_Fail;
			break;
	}

	return ret;
}